

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5Porter_Ostar(char *zStem,int nStem)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  int bCons;
  int mask;
  int i;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_4;
  
  if (((*(char *)(in_RDI + (in_ESI + -1)) == 'w') || (*(char *)(in_RDI + (in_ESI + -1)) == 'x')) ||
     (*(char *)(in_RDI + (in_ESI + -1)) == 'y')) {
    local_4 = 0;
  }
  else {
    local_1c = 0;
    local_20 = 0;
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      iVar1 = fts5PorterIsVowel(*(char *)(in_RDI + local_18),local_20);
      local_20 = (uint)((iVar1 != 0 ^ 0xffU) & 1);
      local_1c = local_1c * 2 + local_20;
    }
    local_4 = (uint)((local_1c & 7) == 5);
  }
  return local_4;
}

Assistant:

static int fts5Porter_Ostar(char *zStem, int nStem){
  if( zStem[nStem-1]=='w' || zStem[nStem-1]=='x' || zStem[nStem-1]=='y' ){
    return 0;
  }else{
    int i;
    int mask = 0;
    int bCons = 0;
    for(i=0; i<nStem; i++){
      bCons = !fts5PorterIsVowel(zStem[i], bCons);
      assert( bCons==0 || bCons==1 );
      mask = (mask << 1) + bCons;
    }
    return ((mask & 0x0007)==0x0005);
  }
}